

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectral.hpp
# Opt level: O0

pair<kitty::static_truth_table<5U,_true>,_bool> __thiscall
kitty::detail::miller_spectral_canonization_impl<kitty::static_truth_table<5u,true>>::
run<void(&)(std::vector<kitty::detail::spectral_operation,std::allocator<kitty::detail::spectral_operation>>const&)>
          (miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *this,
          _func_void_vector<kitty::detail::spectral_operation,_std::allocator<kitty::detail::spectral_operation>_>_ptr
          *fn)

{
  undefined8 extraout_RDX;
  code *in_RSI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  pair<kitty::static_truth_table<5U,_true>,_bool> pVar1;
  uint32_t in_stack_0000000c;
  static_truth_table<5U,_true> tt;
  bool exact;
  miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_> *in_stack_00000040;
  static_truth_table<5U,_true> *in_stack_ffffffffffffff98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffb0;
  static_truth_table<5U,_true> *__x;
  static_truth_table<5U,_true> local_48;
  bool local_39;
  static_truth_table<5U,_true> *in_stack_ffffffffffffffc8;
  spectrum *in_stack_ffffffffffffffd0;
  pair<kitty::static_truth_table<5U,_true>,_bool> local_10;
  
  get_rw_coeffecient_order(in_stack_0000000c);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_ffffffffffffffb0,in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_ffffffffffffffb0);
  local_39 = miller_spectral_canonization_impl<kitty::static_truth_table<5U,_true>_>::normalize
                       (in_stack_00000040);
  (*in_RSI)(in_RDI + 7);
  local_48 = static_truth_table<5U,_true>::construct(in_stack_ffffffffffffff98);
  __x = &local_48;
  spectrum::to_truth_table<kitty::static_truth_table<5u,true>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::pair<kitty::static_truth_table<5U,_true>,_bool>::
  pair<kitty::static_truth_table<5U,_true>_&,_true>(&local_10,__x,&local_39);
  pVar1._9_7_ = (undefined7)((ulong)extraout_RDX >> 8);
  pVar1.second = local_10.second;
  pVar1.first._bits = local_10.first._bits;
  return pVar1;
}

Assistant:

std::pair<TT, bool> run( Callback&& fn )
  {
    order = get_rw_coeffecient_order( num_vars );
    const auto exact = normalize();

    fn( best_transforms );

    TT tt = func.construct();
    spec.to_truth_table<TT>( tt );
    return { tt, exact };
  }